

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase194::run(TestCase194 *this)

{
  PointerBuilder builder_00;
  PointerReader reader;
  PointerReader reader_00;
  PointerReader reader_01;
  Builder builder_01;
  Reader reader_02;
  Builder builder_02;
  Reader reader_03;
  Reader reader_04;
  Reader reader_05;
  Builder reader_06;
  Reader reader_07;
  Reader reader_08;
  Reader reader_09;
  PointerBuilder builder_03;
  PointerReader reader_10;
  PointerReader reader_11;
  PointerReader reader_12;
  StructSchema schema;
  StructSchema schema_00;
  size_type sVar1;
  ulong uVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ListSchema LVar6;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  initializer_list<unsigned_int> expected;
  initializer_list<unsigned_int> expected_00;
  initializer_list<unsigned_int> expected_01;
  initializer_list<unsigned_int> expected_02;
  Fault f;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  undefined8 in_stack_fffffffffffffbf8;
  undefined8 in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  undefined2 in_stack_fffffffffffffc0c;
  undefined2 in_stack_fffffffffffffc0e;
  undefined4 local_3f0;
  ReaderFor<AnyPointer> local_3d8;
  BuilderFor<capnp::DynamicList> list;
  Builder root;
  ListElementCount local_348 [6];
  Builder local_330;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  ReaderFor<capnproto_test::capnp::test::TestAllTypes> local_220;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  Reader local_1c0;
  Reader local_180;
  Reader local_140;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::DynamicStruct,capnp::StructSchema>
            (&root,&builder.super_MessageBuilder,(StructSchema)0x662410);
  name.content.size_ = 0x10;
  name.content.ptr = "anyPointerField";
  DynamicStruct::Builder::get((Builder *)&f,&root,name);
  DynamicValue::Builder::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
            ((BuilderFor<AnyPointer> *)&list,(Builder *)&f);
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
            ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)&local_1f0,
             (EVP_PKEY_CTX *)(schemas::s_a0a8f314b80b63fd + 0x48));
  builder_01.builder.segment = (SegmentBuilder *)uStack_1e8;
  builder_01.schema.super_Schema.raw = (Schema)(Schema)local_1f0;
  builder_01.builder.capTable = (CapTableBuilder *)local_1e0;
  builder_01.builder.data = (void *)uStack_1d8;
  builder_01.builder.pointers = (WirePointer *)local_1d0;
  builder_01.builder.dataSize = (undefined4)uStack_1c8;
  builder_01.builder.pointerCount = uStack_1c8._4_2_;
  builder_01.builder._38_2_ = uStack_1c8._6_2_;
  initDynamicTestMessage(builder_01);
  DynamicValue::Builder::~Builder((Builder *)&f);
  DynamicStruct::Builder::asReader((Reader *)&f,&root);
  Schema::requireUsableAs<capnproto_test::capnp::test::TestAnyPointer>((Schema *)&f);
  bVar3 = in_stack_fffffffffffffc0c != 0;
  list.builder.segment = (SegmentBuilder *)0x0;
  if (bVar3) {
    list.builder.segment = (SegmentBuilder *)in_stack_fffffffffffffc00;
  }
  list.builder.capTable._0_4_ = 0x7fffffff;
  if (bVar3) {
    list.builder.capTable._0_4_ = local_3f0;
  }
  list.schema.elementType.baseType = VOID;
  list.schema.elementType.listDepth = '\0';
  list.schema.elementType.isImplicitParam = false;
  list.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  list.schema.elementType._6_2_ = 0;
  list.schema.elementType.field_4.scopeId._0_4_ = 0;
  list.schema.elementType.field_4.scopeId._4_4_ = 0;
  if (bVar3) {
    list.schema.elementType._0_4_ = local_418;
    list.schema.elementType._4_4_ = uStack_414;
    list.schema.elementType.field_4.scopeId._0_4_ = in_stack_fffffffffffffbf0;
    list.schema.elementType.field_4.scopeId._4_4_ = in_stack_fffffffffffffbf4;
  }
  AnyPointer::Reader::getAs<capnproto_test::capnp::test::TestAllTypes>(&local_220,(Reader *)&list);
  reader_02._reader.capTable = local_220._reader.capTable;
  reader_02._reader.segment = local_220._reader.segment;
  reader_02._reader.data = local_220._reader.data;
  reader_02._reader.pointers = local_220._reader.pointers;
  reader_02._reader.dataSize = local_220._reader.dataSize;
  reader_02._reader.pointerCount = local_220._reader.pointerCount;
  reader_02._reader._38_2_ = local_220._reader._38_2_;
  reader_02._reader.nestingLimit = local_220._reader.nestingLimit;
  reader_02._reader._44_4_ = local_220._reader._44_4_;
  checkTestMessage(reader_02);
  DynamicStruct::Builder::asReader((Reader *)&list,&root);
  name_00.content.size_ = 0x10;
  name_00.content.ptr = "anyPointerField";
  DynamicStruct::Reader::get((Reader *)&f,(Reader *)&list,name_00);
  DynamicValue::Reader::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply(&local_3d8,(Reader *)&f);
  reader_10.segment._4_4_ = in_stack_fffffffffffffbf4;
  reader_10.segment._0_4_ = in_stack_fffffffffffffbf0;
  reader_10.capTable = (CapTableReader *)in_stack_fffffffffffffbf8;
  reader_10.pointer = (WirePointer *)in_stack_fffffffffffffc00;
  reader_10.nestingLimit = in_stack_fffffffffffffc08;
  reader_10._28_2_ = in_stack_fffffffffffffc0c;
  reader_10._30_2_ = in_stack_fffffffffffffc0e;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            (reader_10,(StructSchema)local_3d8.reader.capTable);
  reader_03.reader.segment = (SegmentReader *)uStack_280;
  reader_03.schema.super_Schema.raw = (Schema)(Schema)local_288;
  reader_03.reader.capTable = (CapTableReader *)local_278;
  reader_03.reader.data = (void *)uStack_270;
  reader_03.reader.pointers = (WirePointer *)local_268;
  reader_03.reader.dataSize = (undefined4)uStack_260;
  reader_03.reader.pointerCount = uStack_260._4_2_;
  reader_03.reader._38_2_ = uStack_260._6_2_;
  reader_03.reader._40_8_ = local_258;
  checkDynamicTestMessage(reader_03);
  DynamicValue::Reader::~Reader((Reader *)&f);
  DynamicStruct::Builder::asReader((Reader *)&list,&root);
  name_01.content.size_ = 0x10;
  name_01.content.ptr = "anyPointerField";
  DynamicStruct::Reader::get((Reader *)&f,(Reader *)&list,name_01);
  DynamicValue::Reader::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply(&local_3d8,(Reader *)&f);
  reader_11.segment._4_4_ = in_stack_fffffffffffffbf4;
  reader_11.segment._0_4_ = in_stack_fffffffffffffbf0;
  reader_11.capTable = (CapTableReader *)in_stack_fffffffffffffbf8;
  reader_11.pointer = (WirePointer *)in_stack_fffffffffffffc00;
  reader_11.nestingLimit = in_stack_fffffffffffffc08;
  reader_11._28_2_ = in_stack_fffffffffffffc0c;
  reader_11._30_2_ = in_stack_fffffffffffffc0e;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
            (reader_11,(StructSchema)local_3d8.reader.capTable);
  reader_04.reader.segment = (SegmentReader *)uStack_2b8;
  reader_04.schema.super_Schema.raw = (Schema)(Schema)local_2c0;
  reader_04.reader.capTable = (CapTableReader *)local_2b0;
  reader_04.reader.data = (void *)uStack_2a8;
  reader_04.reader.pointers = (WirePointer *)local_2a0;
  reader_04.reader.dataSize = (undefined4)uStack_298;
  reader_04.reader.pointerCount = uStack_298._4_2_;
  reader_04.reader._38_2_ = uStack_298._6_2_;
  reader_04.reader._40_8_ = local_290;
  checkDynamicTestMessage(reader_04);
  DynamicValue::Reader::~Reader((Reader *)&f);
  name_02.content.size_ = 0x10;
  name_02.content.ptr = "anyPointerField";
  DynamicStruct::Builder::get((Builder *)&f,&root,name_02);
  DynamicValue::Builder::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
            ((BuilderFor<AnyPointer> *)&local_3d8,(Builder *)&f);
  PointerBuilder::asReader((PointerBuilder *)&local_3d8);
  schema_00.super_Schema.raw._4_4_ = list.schema.elementType.field_4.scopeId._4_4_;
  schema_00.super_Schema.raw._0_4_ = list.schema.elementType.field_4.scopeId._0_4_;
  reader_12.segment._4_4_ = in_stack_fffffffffffffbf4;
  reader_12.segment._0_4_ = in_stack_fffffffffffffbf0;
  reader_12.capTable = (CapTableReader *)in_stack_fffffffffffffbf8;
  reader_12.pointer = (WirePointer *)in_stack_fffffffffffffc00;
  reader_12.nestingLimit = in_stack_fffffffffffffc08;
  reader_12._28_2_ = in_stack_fffffffffffffc0c;
  reader_12._30_2_ = in_stack_fffffffffffffc0e;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic(reader_12,schema_00);
  reader_05.reader.segment = (SegmentReader *)uStack_2f0;
  reader_05.schema.super_Schema.raw = (Schema)(Schema)local_2f8;
  reader_05.reader.capTable = (CapTableReader *)local_2e8;
  reader_05.reader.data = (void *)uStack_2e0;
  reader_05.reader.pointers = (WirePointer *)local_2d8;
  reader_05.reader.dataSize = (undefined4)uStack_2d0;
  reader_05.reader.pointerCount = uStack_2d0._4_2_;
  reader_05.reader._38_2_ = uStack_2d0._6_2_;
  reader_05.reader._40_8_ = local_2c8;
  checkDynamicTestMessage(reader_05);
  DynamicValue::Builder::~Builder((Builder *)&f);
  name_03.content.size_ = 0x10;
  name_03.content.ptr = "anyPointerField";
  DynamicStruct::Builder::get((Builder *)&f,&root,name_03);
  DynamicValue::Builder::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
            ((BuilderFor<AnyPointer> *)&list,(Builder *)&f);
  schema.super_Schema.raw._4_2_ = list.schema.elementType.field_3;
  schema.super_Schema.raw._6_2_ = list.schema.elementType._6_2_;
  schema.super_Schema.raw._0_2_ = list.schema.elementType.baseType;
  schema.super_Schema.raw._2_1_ = list.schema.elementType.listDepth;
  schema.super_Schema.raw._3_1_ = list.schema.elementType.isImplicitParam;
  builder_03.segment._4_4_ = in_stack_fffffffffffffbf4;
  builder_03.segment._0_4_ = in_stack_fffffffffffffbf0;
  builder_03.capTable = (CapTableBuilder *)in_stack_fffffffffffffbf8;
  builder_03.pointer = (WirePointer *)in_stack_fffffffffffffc00;
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic(builder_03,schema);
  builder_02.builder.segment = (SegmentBuilder *)uStack_248;
  builder_02.schema.super_Schema.raw = (Schema)(Schema)local_250;
  builder_02.builder.capTable = (CapTableBuilder *)local_240;
  builder_02.builder.data = (void *)uStack_238;
  builder_02.builder.pointers = (WirePointer *)local_230;
  builder_02.builder.dataSize = (undefined4)uStack_228;
  builder_02.builder.pointerCount = uStack_228._4_2_;
  builder_02.builder._38_2_ = uStack_228._6_2_;
  checkDynamicTestMessage(builder_02);
  DynamicValue::Builder::~Builder((Builder *)&f);
  DynamicStruct::Builder::init((Builder *)&f,(EVP_PKEY_CTX *)&root);
  DynamicValue::Builder::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
            ((BuilderFor<AnyPointer> *)&local_3d8,(Builder *)&f);
  ListSchema::FromImpl<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get();
  PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::init((EVP_PKEY_CTX *)&list);
  DynamicValue::Builder::~Builder((Builder *)&f);
  f.exception._0_4_ = 3;
  DynamicList::Builder::set(&list,0,(Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  f.exception._0_4_ = 3;
  DynamicList::Builder::set(&list,1,(Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  f.exception._0_4_ = 3;
  DynamicList::Builder::set(&list,2,(Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  f.exception._0_4_ = 3;
  DynamicList::Builder::set(&list,3,(Reader *)&f);
  DynamicValue::Reader::~Reader((Reader *)&f);
  DynamicStruct::Builder::asReader((Reader *)&f,&root);
  Schema::requireUsableAs<capnproto_test::capnp::test::TestAnyPointer>((Schema *)&f);
  bVar3 = in_stack_fffffffffffffc0c != 0;
  local_3d8.reader.pointer = (WirePointer *)(SegmentBuilder *)0x0;
  if (bVar3) {
    local_3d8.reader.pointer = (WirePointer *)in_stack_fffffffffffffc00;
  }
  local_3d8.reader.nestingLimit = 0x7fffffff;
  if (bVar3) {
    local_3d8.reader.nestingLimit = local_3f0;
  }
  local_418 = 0;
  uVar4 = 0;
  uVar5 = 0;
  if (bVar3) {
    local_418 = 0x75bcd15;
    uVar4 = in_stack_fffffffffffffbf0;
    uVar5 = in_stack_fffffffffffffbf4;
  }
  local_3d8.reader.segment = (SegmentReader *)(ulong)(uint)local_418;
  local_3d8.reader.capTable = (CapTableReader *)CONCAT44(uVar5,uVar4);
  AnyPointer::Reader::getAs<capnp::List<unsigned_int,(capnp::Kind)0>>
            ((ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> *)&list,&local_3d8);
  if (list.builder.capTable._0_4_ == 4) {
    if (kj::_::Debug::minSeverity < 3 &&
        *(int *)&((list.builder.segment)->super_SegmentReader).arena != 0x7b) {
      f.exception._0_4_ = 0x7b;
      local_3d8.reader.segment =
           (SegmentReader *)
           CONCAT44(local_3d8.reader.segment._4_4_,
                    *(undefined4 *)&((list.builder.segment)->super_SegmentReader).arena);
      kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xe7,ERROR,"\"failed: expected \" \"(123u) == (list[0])\", 123u, list[0]",
                 (char (*) [37])"failed: expected (123u) == (list[0])",(uint *)&f,(uint *)&local_3d8
                );
    }
    if (kj::_::Debug::minSeverity < 3 &&
        *(int *)((long)&((list.builder.segment)->super_SegmentReader).arena +
                (ulong)(list.builder.capTable._4_4_ >> 3)) != 0x1c8) {
      f.exception._0_4_ = 0x1c8;
      local_3d8.reader.segment =
           (SegmentReader *)
           CONCAT44(local_3d8.reader.segment._4_4_,
                    *(undefined4 *)
                     ((long)&((list.builder.segment)->super_SegmentReader).arena +
                     (ulong)(list.builder.capTable._4_4_ >> 3)));
      kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xe8,ERROR,"\"failed: expected \" \"(456u) == (list[1])\", 456u, list[1]",
                 (char (*) [37])"failed: expected (456u) == (list[1])",(uint *)&f,(uint *)&local_3d8
                );
    }
    if (kj::_::Debug::minSeverity < 3 &&
        *(int *)((long)&((list.builder.segment)->super_SegmentReader).arena +
                (ulong)(list.builder.capTable._4_4_ >> 2)) != 0x315) {
      f.exception._0_4_ = 0x315;
      local_3d8.reader.segment =
           (SegmentReader *)
           CONCAT44(local_3d8.reader.segment._4_4_,
                    *(undefined4 *)
                     ((long)&((list.builder.segment)->super_SegmentReader).arena +
                     (ulong)(list.builder.capTable._4_4_ >> 2)));
      kj::_::Debug::log<char_const(&)[37],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xe9,ERROR,"\"failed: expected \" \"(789u) == (list[2])\", 789u, list[2]",
                 (char (*) [37])"failed: expected (789u) == (list[2])",(uint *)&f,(uint *)&local_3d8
                );
    }
    uVar2 = (ulong)list.builder.capTable._4_4_ * 3 >> 3;
    if ((*(int *)((long)&((list.builder.segment)->super_SegmentReader).arena + uVar2) != 0x75bcd15)
       && (kj::_::Debug::minSeverity < 3)) {
      f.exception._0_4_ = 0x75bcd15;
      local_3d8.reader.segment =
           (SegmentReader *)
           CONCAT44(local_3d8.reader.segment._4_4_,
                    *(undefined4 *)
                     ((long)&((list.builder.segment)->super_SegmentReader).arena + uVar2));
      kj::_::Debug::log<char_const(&)[43],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0xea,ERROR,
                 "\"failed: expected \" \"(123456789u) == (list[3])\", 123456789u, list[3]",
                 (char (*) [43])"failed: expected (123456789u) == (list[3])",(uint *)&f,
                 (uint *)&local_3d8);
    }
    DynamicStruct::Builder::asReader((Reader *)&list,&root);
    name_04.content.size_ = 0x10;
    name_04.content.ptr = "anyPointerField";
    DynamicStruct::Reader::get((Reader *)&f,(Reader *)&list,name_04);
    DynamicValue::Reader::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply(&local_3d8,(Reader *)&f);
    LVar6 = ListSchema::FromImpl<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get();
    sVar1 = LVar6.elementType._0_8_;
    reader._28_4_ = local_3d8.reader._28_4_;
    reader.nestingLimit = local_3d8.reader.nestingLimit;
    reader.capTable = local_3d8.reader.capTable;
    reader.segment = local_3d8.reader.segment;
    reader.pointer = local_3d8.reader.pointer;
    PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic(&local_140,reader,LVar6);
    local_348[0] = 0x7b;
    local_348[1] = 0x1c8;
    local_348[2] = 0x315;
    local_348[3] = 0x75bcd15;
    reader_07.schema.elementType.field_4.schema = local_140.schema.elementType.field_4.schema;
    reader_07.schema.elementType.baseType = local_140.schema.elementType.baseType;
    reader_07.schema.elementType.listDepth = local_140.schema.elementType.listDepth;
    reader_07.schema.elementType.isImplicitParam = local_140.schema.elementType.isImplicitParam;
    reader_07.schema.elementType.field_3 = local_140.schema.elementType.field_3;
    reader_07.schema.elementType._6_2_ = local_140.schema.elementType._6_2_;
    reader_07.reader.segment = local_140.reader.segment;
    reader_07.reader.capTable = local_140.reader.capTable;
    reader_07.reader.ptr = local_140.reader.ptr;
    reader_07.reader.elementCount = local_140.reader.elementCount;
    reader_07.reader.step = local_140.reader.step;
    reader_07.reader.structDataSize = local_140.reader.structDataSize;
    reader_07.reader.structPointerCount = local_140.reader.structPointerCount;
    reader_07.reader.elementSize = local_140.reader.elementSize;
    reader_07.reader._39_1_ = local_140.reader._39_1_;
    reader_07.reader.nestingLimit = local_140.reader.nestingLimit;
    reader_07.reader._44_4_ = local_140.reader._44_4_;
    expected._M_len = sVar1;
    expected._M_array = local_348;
    (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Reader>(reader_07,expected);
    DynamicValue::Reader::~Reader((Reader *)&f);
    DynamicStruct::Builder::asReader((Reader *)&list,&root);
    name_05.content.size_ = 0x10;
    name_05.content.ptr = "anyPointerField";
    DynamicStruct::Reader::get((Reader *)&f,(Reader *)&list,name_05);
    DynamicValue::Reader::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply(&local_3d8,(Reader *)&f);
    LVar6 = ListSchema::FromImpl<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get();
    sVar1 = LVar6.elementType._0_8_;
    reader_00._28_4_ = local_3d8.reader._28_4_;
    reader_00.nestingLimit = local_3d8.reader.nestingLimit;
    reader_00.capTable = local_3d8.reader.capTable;
    reader_00.segment = local_3d8.reader.segment;
    reader_00.pointer = local_3d8.reader.pointer;
    PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic(&local_180,reader_00,LVar6);
    local_348[0] = 0x7b;
    local_348[1] = 0x1c8;
    local_348[2] = 0x315;
    local_348[3] = 0x75bcd15;
    reader_08.schema.elementType.field_4.schema = local_180.schema.elementType.field_4.schema;
    reader_08.schema.elementType.baseType = local_180.schema.elementType.baseType;
    reader_08.schema.elementType.listDepth = local_180.schema.elementType.listDepth;
    reader_08.schema.elementType.isImplicitParam = local_180.schema.elementType.isImplicitParam;
    reader_08.schema.elementType.field_3 = local_180.schema.elementType.field_3;
    reader_08.schema.elementType._6_2_ = local_180.schema.elementType._6_2_;
    reader_08.reader.segment = local_180.reader.segment;
    reader_08.reader.capTable = local_180.reader.capTable;
    reader_08.reader.ptr = local_180.reader.ptr;
    reader_08.reader.elementCount = local_180.reader.elementCount;
    reader_08.reader.step = local_180.reader.step;
    reader_08.reader.structDataSize = local_180.reader.structDataSize;
    reader_08.reader.structPointerCount = local_180.reader.structPointerCount;
    reader_08.reader.elementSize = local_180.reader.elementSize;
    reader_08.reader._39_1_ = local_180.reader._39_1_;
    reader_08.reader.nestingLimit = local_180.reader.nestingLimit;
    reader_08.reader._44_4_ = local_180.reader._44_4_;
    expected_00._M_len = sVar1;
    expected_00._M_array = local_348;
    (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Reader>(reader_08,expected_00)
    ;
    DynamicValue::Reader::~Reader((Reader *)&f);
    name_06.content.size_ = 0x10;
    name_06.content.ptr = "anyPointerField";
    DynamicStruct::Builder::get((Builder *)&f,&root,name_06);
    DynamicValue::Builder::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
              ((BuilderFor<AnyPointer> *)&local_3d8,(Builder *)&f);
    PointerBuilder::asReader((PointerBuilder *)&local_3d8);
    LVar6 = ListSchema::FromImpl<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get();
    sVar1 = LVar6.elementType._0_8_;
    reader_01.segment._4_2_ = list.schema.elementType.field_3;
    reader_01.segment._6_2_ = list.schema.elementType._6_2_;
    reader_01.segment._0_2_ = list.schema.elementType.baseType;
    reader_01.segment._2_1_ = list.schema.elementType.listDepth;
    reader_01.segment._3_1_ = list.schema.elementType.isImplicitParam;
    reader_01.capTable._4_4_ = list.schema.elementType.field_4.scopeId._4_4_;
    reader_01.capTable._0_4_ = list.schema.elementType.field_4.scopeId._0_4_;
    reader_01._28_4_ = list.builder.capTable._4_4_;
    reader_01.nestingLimit = list.builder.capTable._0_4_;
    reader_01.pointer = (WirePointer *)list.builder.segment;
    PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic(&local_1c0,reader_01,LVar6);
    local_348[0] = 0x7b;
    local_348[1] = 0x1c8;
    local_348[2] = 0x315;
    local_348[3] = 0x75bcd15;
    reader_09.schema.elementType.field_4.schema = local_1c0.schema.elementType.field_4.schema;
    reader_09.schema.elementType.baseType = local_1c0.schema.elementType.baseType;
    reader_09.schema.elementType.listDepth = local_1c0.schema.elementType.listDepth;
    reader_09.schema.elementType.isImplicitParam = local_1c0.schema.elementType.isImplicitParam;
    reader_09.schema.elementType.field_3 = local_1c0.schema.elementType.field_3;
    reader_09.schema.elementType._6_2_ = local_1c0.schema.elementType._6_2_;
    reader_09.reader.segment = local_1c0.reader.segment;
    reader_09.reader.capTable = local_1c0.reader.capTable;
    reader_09.reader.ptr = local_1c0.reader.ptr;
    reader_09.reader.elementCount = local_1c0.reader.elementCount;
    reader_09.reader.step = local_1c0.reader.step;
    reader_09.reader.structDataSize = local_1c0.reader.structDataSize;
    reader_09.reader.structPointerCount = local_1c0.reader.structPointerCount;
    reader_09.reader.elementSize = local_1c0.reader.elementSize;
    reader_09.reader._39_1_ = local_1c0.reader._39_1_;
    reader_09.reader.nestingLimit = local_1c0.reader.nestingLimit;
    reader_09.reader._44_4_ = local_1c0.reader._44_4_;
    expected_01._M_len = sVar1;
    expected_01._M_array = local_348;
    (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Reader>(reader_09,expected_01)
    ;
    DynamicValue::Builder::~Builder((Builder *)&f);
    name_07.content.size_ = 0x10;
    name_07.content.ptr = "anyPointerField";
    DynamicStruct::Builder::get((Builder *)&f,&root,name_07);
    DynamicValue::Builder::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
              ((BuilderFor<AnyPointer> *)&list,(Builder *)&f);
    LVar6 = ListSchema::FromImpl<capnp::List<unsigned_int,_(capnp::Kind)0>_>::get();
    sVar1 = LVar6.elementType._0_8_;
    builder_00.segment._4_2_ = list.schema.elementType.field_3;
    builder_00.segment._6_2_ = list.schema.elementType._6_2_;
    builder_00.segment._0_2_ = list.schema.elementType.baseType;
    builder_00.segment._2_1_ = list.schema.elementType.listDepth;
    builder_00.segment._3_1_ = list.schema.elementType.isImplicitParam;
    builder_00.capTable._4_4_ = list.schema.elementType.field_4.scopeId._4_4_;
    builder_00.capTable._0_4_ = list.schema.elementType.field_4.scopeId._0_4_;
    builder_00.pointer = (WirePointer *)list.builder.segment;
    PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic(&local_330,builder_00,LVar6);
    local_3d8.reader.segment = (SegmentReader *)0x1c80000007b;
    local_3d8.reader.capTable = (CapTableReader *)0x75bcd1500000315;
    reader_06.schema.elementType.field_4.schema = local_330.schema.elementType.field_4.schema;
    reader_06.schema.elementType.baseType = local_330.schema.elementType.baseType;
    reader_06.schema.elementType.listDepth = local_330.schema.elementType.listDepth;
    reader_06.schema.elementType.isImplicitParam = local_330.schema.elementType.isImplicitParam;
    reader_06.schema.elementType.field_3 = local_330.schema.elementType.field_3;
    reader_06.schema.elementType._6_2_ = local_330.schema.elementType._6_2_;
    reader_06.builder.segment = local_330.builder.segment;
    reader_06.builder.capTable = local_330.builder.capTable;
    reader_06.builder.ptr = local_330.builder.ptr;
    reader_06.builder.elementCount = local_330.builder.elementCount;
    reader_06.builder.step = local_330.builder.step;
    reader_06.builder.structDataSize = local_330.builder.structDataSize;
    reader_06.builder.structPointerCount = local_330.builder.structPointerCount;
    reader_06.builder.elementSize = local_330.builder.elementSize;
    reader_06.builder._39_1_ = local_330.builder._39_1_;
    expected_02._M_len = sVar1;
    expected_02._M_array = (iterator)&local_3d8;
    (anonymous_namespace)::checkList<unsigned_int,capnp::DynamicList::Builder>
              (reader_06,expected_02);
    DynamicValue::Builder::~Builder((Builder *)&f);
    MallocMessageBuilder::~MallocMessageBuilder(&builder);
    return;
  }
  local_3d8.reader.segment = (SegmentReader *)CONCAT44(local_3d8.reader.segment._4_4_,4);
  local_348[0] = list.builder.capTable._0_4_;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic-test.c++"
             ,0xe6,FAILED,"(4u) == (list.size())","4u, list.size()",(uint *)&local_3d8,local_348);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

TEST(DynamicApi, DynamicAnyPointers) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<DynamicStruct>(Schema::from<test::TestAnyPointer>());

  initDynamicTestMessage(
      root.get("anyPointerField").as<AnyPointer>()
          .initAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkTestMessage(
      root.asReader().as<test::TestAnyPointer>().getAnyPointerField().getAs<TestAllTypes>());

  checkDynamicTestMessage(
      root.asReader().get("anyPointerField").as<AnyPointer>()
          .getAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkDynamicTestMessage(
      root.asReader().get("anyPointerField").as<AnyPointer>()
          .getAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkDynamicTestMessage(
      root.get("anyPointerField").as<AnyPointer>().asReader()
          .getAs<DynamicStruct>(Schema::from<TestAllTypes>()));
  checkDynamicTestMessage(
      root.get("anyPointerField").as<AnyPointer>()
          .getAs<DynamicStruct>(Schema::from<TestAllTypes>()));

  {
    {
      auto list = root.init("anyPointerField").as<AnyPointer>()
                      .initAs<DynamicList>(Schema::from<List<uint32_t>>(), 4);
      list.set(0, 123);
      list.set(1, 456);
      list.set(2, 789);
      list.set(3, 123456789);
    }

    {
      auto list = root.asReader().as<test::TestAnyPointer>()
          .getAnyPointerField().getAs<List<uint32_t>>();
      ASSERT_EQ(4u, list.size());
      EXPECT_EQ(123u, list[0]);
      EXPECT_EQ(456u, list[1]);
      EXPECT_EQ(789u, list[2]);
      EXPECT_EQ(123456789u, list[3]);
    }

    checkList<uint32_t>(
        root.asReader().get("anyPointerField").as<AnyPointer>()
            .getAs<DynamicList>(Schema::from<List<uint32_t>>()),
        {123u, 456u, 789u, 123456789u});
    checkList<uint32_t>(
        root.asReader().get("anyPointerField").as<AnyPointer>()
            .getAs<DynamicList>(Schema::from<List<uint32_t>>()),
        {123u, 456u, 789u, 123456789u});
    checkList<uint32_t>(
        root.get("anyPointerField").as<AnyPointer>().asReader()
            .getAs<DynamicList>(Schema::from<List<uint32_t>>()),
        {123u, 456u, 789u, 123456789u});
    checkList<uint32_t>(
        root.get("anyPointerField").as<AnyPointer>()
            .getAs<DynamicList>(Schema::from<List<uint32_t>>()),
        {123u, 456u, 789u, 123456789u});
  }
}